

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxBuffer.cpp
# Opt level: O3

void __thiscall Jinx::Buffer::Read(Buffer *this,size_t *pos,void *data,size_t bytes)

{
  if (this->m_size - *pos < bytes) {
    __assert_fail("bytes <= (m_size - *pos)",
                  "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxBuffer.cpp"
                  ,0x22,"void Jinx::Buffer::Read(size_t *, void *, size_t)");
  }
  if (bytes != 0) {
    memcpy(data,this->m_data + *pos,bytes);
    *pos = *pos + bytes;
    return;
  }
  __assert_fail("bytesToCopy",
                "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxBuffer.cpp"
                ,0x24,"void Jinx::Buffer::Read(size_t *, void *, size_t)");
}

Assistant:

inline_t void Buffer::Read(size_t * pos, void * data, size_t bytes)
	{
		assert(bytes <= (m_size - *pos));
		size_t bytesToCopy = std::min(bytes, m_size - *pos);
		assert(bytesToCopy);
		assert(bytesToCopy == bytes);
		memcpy(data, m_data + *pos, bytesToCopy);
		*pos += bytes;
	}